

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O0

vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> * __thiscall
libDAI::MaxPlus::beliefs(MaxPlus *this)

{
  long *plVar1;
  ulong uVar2;
  TFactor<double> *this_00;
  long *in_RSI;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *in_RDI;
  size_t in_stack_00000050;
  MaxPlus *in_stack_00000058;
  size_t I;
  size_t i;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *result;
  value_type *in_stack_ffffffffffffff08;
  TFactor<double> *in_stack_ffffffffffffff10;
  TFactor<double> *local_70;
  size_t in_stack_ffffffffffffffc0;
  MaxPlus *in_stack_ffffffffffffffc8;
  ulong local_20;
  
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xbb36fe)
  ;
  local_20 = 0;
  while( true ) {
    plVar1 = (long *)(**(code **)(*in_RSI + 0x20))();
    uVar2 = (**(code **)(*plVar1 + 0x28))();
    if (uVar2 <= local_20) break;
    beliefV(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    TFactor<double>::~TFactor(in_stack_ffffffffffffff10);
    local_20 = local_20 + 1;
  }
  local_70 = (TFactor<double> *)0x0;
  while( true ) {
    plVar1 = (long *)(**(code **)(*in_RSI + 0x20))();
    this_00 = (TFactor<double> *)(**(code **)(*plVar1 + 0x48))();
    if (this_00 <= local_70) break;
    beliefF(in_stack_00000058,in_stack_00000050);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)this_00
               ,in_stack_ffffffffffffff08);
    TFactor<double>::~TFactor(this_00);
    local_70 = (TFactor<double> *)
               ((long)&((_Vector_impl_data *)
                       &(local_70->_vs)._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>)->_M_start + 1
               );
  }
  return in_RDI;
}

Assistant:

vector<Factor> MaxPlus::beliefs() const {
        vector<Factor> result;
        for( size_t i = 0; i < grm().nrVars(); i++ )
            result.push_back( beliefV(i) );
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            result.push_back( beliefF(I) );
        return result;
    }